

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBegin_advanced_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params_00;
  size_t sVar1;
  long lVar2;
  ZSTD_CCtx_params *pZVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [24];
  undefined1 in_stack_ffffffffffffff34 [100];
  undefined1 auVar13 [24];
  
  bVar5 = 0;
  uVar6 = params.cParams._0_8_;
  uVar7 = params.cParams.hashLog;
  uVar8 = params.cParams.searchLog;
  uVar9 = params.cParams.minMatch;
  uVar10 = params.cParams._20_8_;
  sVar1 = ZSTD_checkCParams(params.cParams);
  if (sVar1 < 0xffffffffffffff89) {
    pZVar3 = &params;
    puVar4 = (undefined8 *)&stack0xffffffffffffff18;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *(undefined8 *)pZVar3;
      pZVar3 = (ZSTD_CCtx_params *)((long)pZVar3 + (ulong)bVar5 * -0x10 + 8);
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    params_00.cParams.chainLog = uVar7;
    params_00.format = (uint)uVar6;
    params_00.cParams.windowLog = SUB84(uVar6,4);
    params_00.cParams.hashLog = uVar8;
    params_00.cParams.searchLog = uVar9;
    params_00.cParams.minMatch = (uint)uVar10;
    params_00.cParams.targetLength = SUB84(uVar10,4);
    auVar11 = in_stack_ffffffffffffff34._4_12_;
    auVar12 = in_stack_ffffffffffffff34._52_24_;
    auVar13 = in_stack_ffffffffffffff34._76_24_;
    params_00.cParams.strategy = in_stack_ffffffffffffff34._0_4_;
    params_00.fParams.contentSizeFlag = auVar11._0_4_;
    params_00.fParams.checksumFlag = auVar11._4_4_;
    params_00.fParams.noDictIDFlag = auVar11._8_4_;
    params_00.compressionLevel = in_stack_ffffffffffffff34._16_4_;
    params_00.forceWindow = in_stack_ffffffffffffff34._20_4_;
    params_00.attachDictPref = in_stack_ffffffffffffff34._24_4_;
    params_00.nbWorkers = in_stack_ffffffffffffff34._28_4_;
    params_00._60_4_ = in_stack_ffffffffffffff34._32_4_;
    params_00.jobSize = in_stack_ffffffffffffff34._36_8_;
    params_00.overlapLog = in_stack_ffffffffffffff34._44_4_;
    params_00.rsyncable = in_stack_ffffffffffffff34._48_4_;
    params_00.ldmParams.enableLdm = auVar12._0_4_;
    params_00.ldmParams.hashLog = auVar12._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar12._8_4_;
    params_00.ldmParams.minMatchLength = auVar12._12_4_;
    params_00.ldmParams.hashRateLog = auVar12._16_4_;
    params_00.ldmParams.windowLog = auVar12._20_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar13._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar13._8_8_;
    params_00.customMem.opaque = (void *)auVar13._16_8_;
    sVar1 = ZSTD_compressBegin_internal
                      (cctx,dict,dictSize,dictContentType,dtlm,cdict,params_00,pledgedSrcSize,
                       ZSTDb_not_buffered);
  }
  return sVar1;
}

Assistant:

size_t ZSTD_compressBegin_advanced_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    ZSTD_CCtx_params params,
                                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_advanced_internal: wlog=%u", params.cParams.windowLog);
    /* compression parameters verification and optimization */
    CHECK_F( ZSTD_checkCParams(params.cParams) );
    return ZSTD_compressBegin_internal(cctx,
                                       dict, dictSize, dictContentType, dtlm,
                                       cdict,
                                       params, pledgedSrcSize,
                                       ZSTDb_not_buffered);
}